

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O2

word Sfm_ComputeInterpolant(Sfm_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  lit *plVar4;
  int *piVar5;
  int iVar6;
  int Var;
  int iVar7;
  uint uVar8;
  word *pwVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  word wVar14;
  int pLits [2];
  word local_38;
  
  iVar6 = sat_solver_nvars(p->pSat);
  sat_solver_setnvars(p->pSat,iVar6 + 1);
  iVar7 = p->iPivotNode;
  Var = Sfm_ObjSatVar(p,iVar7);
  pLits[0] = Abc_Var2Lit(Var,iVar7);
  pLits[1] = Abc_Var2Lit(iVar6,iVar7);
  if (6 < p->vDivIds->nSize) {
    __assert_fail("Vec_IntSize(p->vDivIds) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                  ,0xaa,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
  }
  wVar14 = 0;
  while( true ) {
    p->nSatCalls = p->nSatCalls + 1;
    iVar7 = sat_solver_solve(p->pSat,pLits,(lit *)&local_38,(long)p->pPars->nBTLimit,0,0,0);
    if (iVar7 != 1) {
      if (iVar7 == -1) {
        return wVar14;
      }
      if (iVar7 == 0) {
        return 0x1234567812345678;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xb4,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
    p->vValues->nSize = 0;
    for (iVar7 = 0; iVar7 < p->vDivVars->nSize; iVar7 = iVar7 + 1) {
      iVar6 = Vec_IntEntry(p->vDivVars,iVar7);
      pVVar3 = p->vValues;
      iVar6 = sat_solver_var_value(p->pSat,iVar6);
      Vec_IntPush(pVVar3,iVar6);
    }
    pVVar3 = p->vLits;
    pVVar3->nSize = 0;
    iVar7 = Abc_LitNot(pLits[0]);
    Vec_IntPush(pVVar3,iVar7);
    for (iVar7 = 0; iVar7 < p->vDivIds->nSize; iVar7 = iVar7 + 1) {
      uVar8 = Vec_IntEntry(p->vDivIds,iVar7);
      if (((int)uVar8 < 0) || (p->pSat->size <= (int)uVar8)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
      }
      Vec_IntPush(p->vLits,(uint)(p->pSat->model[uVar8] != 1) + uVar8 * 2);
    }
    p->nSatCalls = p->nSatCalls + 1;
    plVar4 = p->vLits->pArray;
    iVar7 = sat_solver_solve(p->pSat,plVar4,plVar4 + p->vLits->nSize,(long)p->pPars->nBTLimit,0,0,0)
    ;
    if (iVar7 != -1) break;
    pVVar3 = p->vLits;
    piVar5 = (p->pSat->conf_final).ptr;
    uVar8 = (p->pSat->conf_final).size;
    pVVar3->nSize = 0;
    local_38 = wVar14;
    iVar7 = Abc_LitNot(pLits[1]);
    Vec_IntPush(pVVar3,iVar7);
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    uVar12 = 0xffffffffffffffff;
    for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
      iVar7 = piVar5[uVar11];
      if (iVar7 != pLits[0]) {
        Vec_IntPush(p->vLits,iVar7);
        uVar1 = piVar5[uVar11];
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar2 = p->vDivIds->nSize;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        pwVar9 = s_Truths6;
        uVar10 = 0;
        while( true ) {
          if (uVar2 == uVar10) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                          ,0xd0,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
          }
          if (p->vDivIds->pArray[uVar10] == uVar1 >> 1) break;
          uVar10 = uVar10 + 1;
          pwVar9 = pwVar9 + 1;
        }
        uVar12 = uVar12 & ((ulong)(uVar1 & 1) - 1 ^ *pwVar9);
      }
    }
    plVar4 = p->vLits->pArray;
    iVar7 = sat_solver_addclause(p->pSat,plVar4,plVar4 + p->vLits->nSize);
    wVar14 = local_38 | uVar12;
    if (iVar7 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xd5,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
  }
  wVar14 = 0x1234567812345678;
  if (iVar7 != 0) {
    if (iVar7 != 1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xc5,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
    for (lVar13 = 0; lVar13 < p->vDivVars->nSize; lVar13 = lVar13 + 1) {
      iVar7 = Vec_IntEntry(p->vDivVars,(int)lVar13);
      iVar6 = Vec_IntEntry(p->vValues,(int)lVar13);
      iVar7 = sat_solver_var_value(p->pSat,iVar7);
      if (iVar6 != iVar7) {
        if (p->vDivCexes->nSize <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar8 = p->nCexes;
        pwVar9 = p->vDivCexes->pArray;
        uVar1 = *(uint *)((long)pwVar9 + lVar13 * 8 + (long)((int)uVar8 >> 5) * 4);
        if ((uVar1 >> (uVar8 & 0x1f) & 1) != 0) {
          __assert_fail("!Abc_InfoHasBit( (unsigned *)pSign, p->nCexes)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                        ,0xde,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
        }
        *(uint *)((long)pwVar9 + lVar13 * 8 + (long)((int)uVar8 >> 5) * 4) =
             1 << ((byte)uVar8 & 0x1f) ^ uVar1;
      }
    }
    p->nCexes = p->nCexes + 1;
    wVar14 = 0x8765432187654321;
  }
  return wVar14;
}

Assistant:

word Sfm_ComputeInterpolant( Sfm_Ntk_t * p )
{
    word * pSign, uCube, uTruth = 0;
    int status, i, Div, iVar, nFinal, * pFinal, nIter = 0;
    int pLits[2], nVars = sat_solver_nvars( p->pSat );
    sat_solver_setnvars( p->pSat, nVars + 1 );
    pLits[0] = Abc_Var2Lit( Sfm_ObjSatVar(p, p->iPivotNode), 0 ); // F = 1
    pLits[1] = Abc_Var2Lit( nVars, 0 ); // iNewLit
    assert( Vec_IntSize(p->vDivIds) <= 6 );
    while ( 1 ) 
    {
        // find onset minterm
        p->nSatCalls++;
        status = sat_solver_solve( p->pSat, pLits, pLits + 2, p->pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SFM_SAT_UNDEC;
        if ( status == l_False )
            return uTruth;
        assert( status == l_True );
        // remember variable values
        Vec_IntClear( p->vValues );
        Vec_IntForEachEntry( p->vDivVars, iVar, i )
            Vec_IntPush( p->vValues, sat_solver_var_value(p->pSat, iVar) );
        // collect divisor literals
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( p->vDivIds, Div, i )
            Vec_IntPush( p->vLits, sat_solver_var_literal(p->pSat, Div) );
        // check against offset
        p->nSatCalls++;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits), p->pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SFM_SAT_UNDEC;
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( p->pSat, &pFinal );
        uCube = ~(word)0;
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( p->vLits, pFinal[i] );
            iVar = Vec_IntFind( p->vDivIds, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits) );
        assert( status );
        nIter++;
    }
    assert( status == l_True );
    // store the counter-example
    Vec_IntForEachEntry( p->vDivVars, iVar, i )
        if ( Vec_IntEntry(p->vValues, i) ^ sat_solver_var_value(p->pSat, iVar) ) // insert 1
        {
            pSign = Vec_WrdEntryP( p->vDivCexes, i );
            assert( !Abc_InfoHasBit( (unsigned *)pSign, p->nCexes) );
            Abc_InfoXorBit( (unsigned *)pSign, p->nCexes );
        }
    p->nCexes++;
    return SFM_SAT_SAT;
}